

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kronrod.cpp
# Opt level: O0

void kronrod(int n,double eps,double *x,double *w1,double *w2)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  double dVar4;
  double y;
  double xx;
  double x1;
  double *tau;
  double s;
  int m;
  int ll;
  int l;
  int k;
  int i;
  bool even;
  double d;
  double coef2;
  double coef;
  double c;
  double bb;
  double *b;
  double an;
  double ak;
  double *w2_local;
  double *w1_local;
  double *x_local;
  double eps_local;
  int n_local;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)((n + 1) / 2 + 1);
  uVar3 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  ak = (double)w2;
  w2_local = w1;
  w1_local = x;
  x_local = (double *)eps;
  eps_local._4_4_ = n;
  bb = (double)operator_new__(uVar3);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)((eps_local._4_4_ + 1) / 2);
  uVar3 = SUB168(auVar2 * ZEXT816(8),0);
  if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  x1 = (double)operator_new__(uVar3);
  s._0_4_ = (eps_local._4_4_ + 1) / 2;
  k._3_1_ = s._0_4_ << 1 == eps_local._4_4_;
  _i = 2.0;
  b = (double *)0x0;
  for (ll = 1; ll <= eps_local._4_4_; ll = ll + 1) {
    b = (double *)((double)b + 1.0);
    _i = (_i * (double)b) / ((double)b + 0.5);
  }
  *(double *)x1 = ((double)b + 2.0) / ((double)b + (double)b + 3.0);
  *(double *)((long)bb + (long)(s._0_4_ + -1) * 8) = *(double *)x1 - 1.0;
  an = (double)b;
  for (m = 1; m < s._0_4_; m = m + 1) {
    an = an + 2.0;
    *(double *)((long)x1 + (long)m * 8) =
         (((an - 1.0) * an + -((double)b * ((double)b + 1.0))) * (an + 2.0) *
         *(double *)((long)x1 + (long)(m + -1) * 8)) /
         (an * ((an + 3.0) * (an + 2.0) + -((double)b * ((double)b + 1.0))));
    *(double *)((long)bb + (long)((s._0_4_ - m) + -1) * 8) = *(double *)((long)x1 + (long)m * 8);
    for (s._4_4_ = 1; s._4_4_ <= m; s._4_4_ = s._4_4_ + 1) {
      *(double *)((long)bb + (long)((s._0_4_ - m) + -1) * 8) =
           *(double *)((long)x1 + (long)(s._4_4_ + -1) * 8) *
           *(double *)((long)bb + (long)((s._0_4_ - m) + s._4_4_ + -1) * 8) +
           *(double *)((long)bb + (long)((s._0_4_ - m) + -1) * 8);
    }
  }
  *(undefined8 *)((long)bb + (long)s._0_4_ * 8) = 0x3ff0000000000000;
  c = sin(1.570796 / ((double)b + (double)b + 1.0));
  xx = sqrt(-c * c + 1.0);
  tau = (double *)(c * 2.0 * xx);
  coef = sqrt(-(double)tau * (double)tau + 1.0);
  coef2 = 1.0 - (1.0 - 1.0 / (double)b) / ((double)b * 8.0 * (double)b);
  y = coef2 * xx;
  d = 2.0 / (double)(eps_local._4_4_ * 2 + 1);
  for (l = 1; l <= eps_local._4_4_; l = l + 1) {
    d = (d * 4.0 * (double)l) / (double)(eps_local._4_4_ + l);
  }
  for (ll = 1; ll <= eps_local._4_4_; ll = ll + 2) {
    abwe1(eps_local._4_4_,s._0_4_,(double)x_local,d,(bool)(k._3_1_ & 1),(double *)bb,&y,
          w2_local + (long)ll + -1);
    *(undefined8 *)((long)ak + (long)(ll + -1) * 8) = 0;
    w1_local[ll + -1] = y;
    dVar4 = xx * coef + -(c * (double)tau);
    c = xx * (double)tau + c * coef;
    if (ll == eps_local._4_4_) {
      y = 0.0;
    }
    else {
      y = coef2 * dVar4;
    }
    xx = dVar4;
    abwe2(eps_local._4_4_,s._0_4_,(double)x_local,d,(bool)(k._3_1_ & 1),(double *)bb,&y,
          w2_local + ll,(double *)((long)ak + (long)ll * 8));
    w1_local[ll] = y;
    dVar4 = xx * coef + -(c * (double)tau);
    c = xx * (double)tau + c * coef;
    y = coef2 * dVar4;
    xx = dVar4;
  }
  if ((k._3_1_ & 1) != 0) {
    y = 0.0;
    abwe1(eps_local._4_4_,s._0_4_,(double)x_local,d,(bool)(k._3_1_ & 1),(double *)bb,&y,
          w2_local + eps_local._4_4_);
    *(undefined8 *)((long)ak + (long)eps_local._4_4_ * 8) = 0;
    w1_local[eps_local._4_4_] = y;
  }
  if (bb != 0.0) {
    operator_delete__((void *)bb);
  }
  if (x1 != 0.0) {
    operator_delete__((void *)x1);
  }
  return;
}

Assistant:

void kronrod ( int n, double eps, double x[], double w1[], double w2[] )

//****************************************************************************80
//
//  Purpose:
//
//    KRONROD adds N+1 points to an N-point Gaussian rule.
//
//  Discussion:
//
//    This subroutine calculates the abscissas and weights of the 2N+1
//    point Gauss Kronrod quadrature formula which is obtained from the 
//    N point Gauss quadrature formula by the optimal addition of N+1 points.
//
//    The optimally added points are called Kronrod abscissas.  The 
//    abscissas and weights for both the Gauss and Gauss Kronrod rules
//    are calculated for integration over the interval [-1,+1].
//
//    Since the quadrature formula is symmetric with respect to the origin,
//    only the nonnegative abscissas are calculated.
//
//    Note that the code published in Mathematics of Computation 
//    omitted the definition of the variable which is here called COEF2.
//
//  Storage:
//
//    Given N, let M = ( N + 1 ) / 2.  
//
//    The Gauss-Kronrod rule will include 2*N+1 points.  However, by symmetry,
//    only N + 1 of them need to be listed.
//
//    The arrays X, W1 and W2 contain the nonnegative abscissas in decreasing
//    order, and the weights of each abscissa in the Gauss-Kronrod and
//    Gauss rules respectively.  This means that about half the entries
//    in W2 are zero.
//
//    For instance, if N = 3, the output is:
//
//    I      X               W1              W2
//
//    1    0.960491        0.104656         0.000000   
//    2    0.774597        0.268488         0.555556    
//    3    0.434244        0.401397         0.000000
//    4    0.000000        0.450917         0.888889
//
//    and if N = 4, (notice that 0 is now a Kronrod abscissa)
//    the output is
//
//    I      X               W1              W2
//
//    1    0.976560        0.062977        0.000000   
//    2    0.861136        0.170054        0.347855    
//    3    0.640286        0.266798        0.000000   
//    4    0.339981        0.326949        0.652145    
//    5    0.000000        0.346443        0.000000
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    02 September 2014
//
//  Author:
//
//    Original FORTRAN77 version by Robert Piessens, Maria Branders.
//    C++ version by John Burkardt.
//
//  Reference:
//
//    Robert Piessens, Maria Branders,
//    A Note on the Optimal Addition of Abscissas to Quadrature Formulas
//    of Gauss and Lobatto,
//    Mathematics of Computation,
//    Volume 28, Number 125, January 1974, pages 135-139.
//
//  Parameters:
//
//    Input, int N, the order of the Gauss rule.
//
//    Input, double EPS, the requested absolute accuracy of the
//    abscissas.
//
//    Output, double X[N+1], the abscissas.
//
//    Output, double W1[N+1], the weights for the Gauss-Kronrod rule.
//
//    Output, double W2[N+1], the weights for 
//    the Gauss rule.
//
{
  double ak;
  double an;
  double *b;
  double bb;
  double c;
  double coef;
  double coef2;
  double d;
  bool even;
  int i;
  int k;
  int l;
  int ll;
  int m;
  double s;
  double *tau;
  double x1;
  double xx;
  double y;

  b = new double[((n+1)/2)+1];
  tau = new double[(n+1)/2];
  
  m = ( n + 1 ) / 2;
  even = ( 2 * m == n );

  d = 2.0;
  an = 0.0;
  for ( k = 1; k <= n; k++ )
  {
    an = an + 1.0;
    d = d * an / ( an + 0.5 );
  }
//
//  Calculation of the Chebyshev coefficients of the orthogonal polynomial.
//
  tau[0] = ( an + 2.0 ) / ( an + an + 3.0 );
  b[m-1] = tau[0] - 1.0;
  ak = an;

  for ( l = 1; l < m; l++ )
  {
    ak = ak + 2.0;
    tau[l] = ( ( ak - 1.0 ) * ak 
      - an * ( an + 1.0 ) ) * ( ak + 2.0 ) * tau[l-1] 
      / ( ak * ( ( ak + 3.0 ) * ( ak + 2.0 ) 
      - an * ( an + 1.0 ) ) );
    b[m-l-1] = tau[l];

    for ( ll = 1; ll <= l; ll++ )
    {
      b[m-l-1] = b[m-l-1] + tau[ll-1] * b[m-l+ll-1];
    }
  }

  b[m] = 1.0;
//
//  Calculation of approximate values for the abscissas.
//
  bb = sin ( 1.570796 / ( an + an + 1.0 ) );
  x1 = sqrt ( 1.0 - bb * bb );
  s = 2.0 * bb * x1;
  c = sqrt ( 1.0 - s * s );
  coef = 1.0 - ( 1.0 - 1.0 / an ) / ( 8.0 * an * an );
  xx = coef * x1;
//
//  Coefficient needed for weights.
//
//  COEF2 = 2^(2*n+1) * n! * n! / (2n+1)! 
//        = 2 * 4^n * n! / product( (n+1)*...*(2*n+1))
//
  coef2 = 2.0 / double( 2 * n + 1 );
  for ( i = 1; i <= n; i++ )
  {
    coef2 = coef2 * 4.0 * double( i ) / double( n + i );
  }
//
//  Calculation of the K-th abscissa (a Kronrod abscissa) and the
//  corresponding weight.
//
  for ( k = 1; k <= n; k = k + 2 )
  {
    abwe1 ( n, m, eps, coef2, even, b, &xx, w1+k-1 );
    w2[k-1] = 0.0;

    x[k-1] = xx;
    y = x1;
    x1 = y * c - bb * s;
    bb = y * s + bb * c;

    if ( k == n )
    {
      xx = 0.0;
    }
    else
    {
      xx = coef * x1;
    }
//
//  Calculation of the K+1 abscissa (a Gaussian abscissa) and the
//  corresponding weights.
//
    abwe2 ( n, m, eps, coef2, even, b, &xx, w1+k, w2+k );

    x[k] = xx;
    y = x1;
    x1 = y * c - bb * s;
    bb = y * s + bb * c;
    xx = coef * x1;
  }
//
//  If N is even, we have one more Kronrod abscissa to compute,
//  namely the origin.
//
  if ( even )
  {
    xx = 0.0;
    abwe1 ( n, m, eps, coef2, even, b, &xx, w1+n );
    w2[n] = 0.0;
    x[n] = xx;
  }

  delete [] b;
  delete [] tau;

  return;
}